

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::TypeParameterDeclarationSyntax::TypeParameterDeclarationSyntax
          (TypeParameterDeclarationSyntax *this,Token keyword,Token typeKeyword,
          ForwardTypeRestrictionSyntax *typeRestriction,
          SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax> *declarators)

{
  bool bVar1;
  pointer in_RCX;
  SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax> *in_RDI;
  size_t in_R8;
  _func_int **in_R9;
  TypeAssignmentSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax> *in_stack_ffffffffffffff90;
  Token in_stack_ffffffffffffff98;
  
  ParameterDeclarationBaseSyntax::ParameterDeclarationBaseSyntax
            ((ParameterDeclarationBaseSyntax *)in_stack_ffffffffffffff90,
             (SyntaxKind)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff98);
  (in_RDI->elements)._M_ptr = in_RCX;
  (in_RDI->elements)._M_extent._M_extent_value = in_R8;
  in_RDI[1].super_SyntaxListBase._vptr_SyntaxListBase = in_R9;
  SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax>::SeparatedSyntaxList
            (in_stack_ffffffffffffff90,in_RDI);
  if ((SyntaxNode *)in_RDI[1].super_SyntaxListBase._vptr_SyntaxListBase != (SyntaxNode *)0x0) {
    ((SyntaxNode *)in_RDI[1].super_SyntaxListBase._vptr_SyntaxListBase)->parent =
         (SyntaxNode *)in_RDI;
  }
  in_RDI[1].super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)in_RDI;
  SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax> *)0x52632d);
  SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax>::end(in_stack_ffffffffffffff90);
  while( true ) {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax>::iterator_base<slang::syntax::TypeAssignmentSyntax_*>_>
                      ((self_type *)in_stack_ffffffffffffff90,
                       (iterator_base<slang::syntax::TypeAssignmentSyntax_*> *)in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffff90 =
         (SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax> *)
         iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax>::iterator_base<slang::syntax::TypeAssignmentSyntax_*>,_false>
         ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax>::iterator_base<slang::syntax::TypeAssignmentSyntax_*>,_false>
                      *)0x52636c);
    *(SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax> **)
     &(in_stack_ffffffffffffff90->super_SyntaxListBase).super_SyntaxNode = in_RDI;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax>::iterator_base<slang::syntax::TypeAssignmentSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax>::iterator_base<slang::syntax::TypeAssignmentSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax>::iterator_base<slang::syntax::TypeAssignmentSyntax_*>,_false>
                *)in_stack_ffffffffffffff90);
  }
  return;
}

Assistant:

TypeParameterDeclarationSyntax(Token keyword, Token typeKeyword, ForwardTypeRestrictionSyntax* typeRestriction, const SeparatedSyntaxList<TypeAssignmentSyntax>& declarators) :
        ParameterDeclarationBaseSyntax(SyntaxKind::TypeParameterDeclaration, keyword), typeKeyword(typeKeyword), typeRestriction(typeRestriction), declarators(declarators) {
        if (this->typeRestriction) this->typeRestriction->parent = this;
        this->declarators.parent = this;
        for (auto child : this->declarators)
            child->parent = this;
    }